

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

nh_bool find_gend(nh_roles_info *ri,char *gend_str,int *out_gend)

{
  int iVar1;
  int local_2c;
  int i;
  int *out_gend_local;
  char *gend_str_local;
  nh_roles_info *ri_local;
  
  local_2c = 0;
  while( true ) {
    if (ri->num_genders <= local_2c) {
      return '\0';
    }
    iVar1 = strcmp(gend_str,ri->gendnames[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *out_gend = local_2c;
  return '\x01';
}

Assistant:

static nh_bool find_gend(const struct nh_roles_info *ri,
			 const char *gend_str, int *out_gend)
{
    int i;

    for (i = 0; i < ri->num_genders; i++) {
	if (!strcmp(gend_str, ri->gendnames[i])) {
	    *out_gend = i;
	    return TRUE;
	}
    }
    return FALSE;
}